

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O0

void __thiscall
agge::tests::VectorRasterizerTests::
InterCellNegativelyInclinedTwoShortHLinesProducePositiveCoverAndArea(VectorRasterizerTests *this)

{
  int x1;
  int y1;
  int x2;
  int y2;
  cells_container *actual;
  allocator local_f1;
  string local_f0 [32];
  LocationInfo local_d0;
  undefined1 auStack_a8 [8];
  cell reference [2];
  undefined1 local_88 [8];
  vector_rasterizer vr;
  VectorRasterizerTests *this_local;
  
  vr._112_8_ = this;
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_88);
  x1 = anon_unknown_5::fp(1.2);
  y1 = anon_unknown_5::fp(1.9);
  x2 = anon_unknown_5::fp(1.5);
  y2 = anon_unknown_5::fp(0.17);
  vector_rasterizer::line((vector_rasterizer *)local_88,x1,y1,x2,y2);
  auStack_a8._0_2_ = 1;
  auStack_a8._2_2_ = 1;
  auStack_a8._4_4_ = -0x7f94;
  reference[0].x = -0xe6;
  reference[0].y = 1;
  reference[0].area = 0x4aa40000;
  reference[0].cover = -1;
  reference[1].x = -0xd4;
  actual = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_f1);
  ut::LocationInfo::LocationInfo(&local_d0,(string *)local_f0,0x352);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,2ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [2])auStack_a8,actual,&local_d0);
  ut::LocationInfo::~LocationInfo(&local_d0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_88);
  return;
}

Assistant:

test( InterCellNegativelyInclinedTwoShortHLinesProducePositiveCoverAndArea )
			{
				// INIT
				vector_rasterizer vr;

				// ACT (ctg = -713)
				vr.line(fp(1.2), fp(1.9), fp(1.5), fp(0.17)); // in fp - [(307, 486); (384, 44)), v(77, -442)

				// ASSERT
				const vector_rasterizer::cell reference[] = {
					{ 1, 1, -32660, -230 }, // dx = 40
					{ 1, 0, -46428, -212 }, // dx = 37
				};

				assert_equal(reference, vr.cells());
			}